

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O1

int8_t * __thiscall
burst::dynamic_tuple::force_align<std::vector<char,std::allocator<char>>>
          (dynamic_tuple *this,vector<char,_std::allocator<char>_> *object)

{
  size_t sVar1;
  char *pcVar2;
  int8_t *piVar3;
  ulong uVar4;
  int8_t *piVar5;
  
  sVar1 = this->m_volume;
  uVar4 = this->m_capacity - sVar1;
  if (uVar4 < 0x18) {
    piVar3 = (int8_t *)0x0;
  }
  else {
    pcVar2 = (this->m_data)._M_t.
             super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
             super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
             super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
    piVar5 = (int8_t *)((ulong)(pcVar2 + sVar1 + 7) & 0xfffffffffffffff8);
    piVar3 = (int8_t *)0x0;
    if ((ulong)((long)piVar5 - (long)(pcVar2 + sVar1)) <= uVar4 - 0x18) {
      piVar3 = piVar5;
    }
  }
  if (piVar3 != (int8_t *)0x0) {
    return piVar3;
  }
  __assert_fail("creation_place != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/dynamic_tuple.hpp"
                ,0x1c5,
                "std::int8_t *burst::dynamic_tuple::force_align(const T &) [T = std::vector<char>]")
  ;
}

Assistant:

std::size_t capacity () const
        {
            return m_capacity;
        }